

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

bool QDir::setCurrent(QString *path)

{
  bool bVar1;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffff98;
  QFileSystemEntry *this;
  QFileSystemEntry local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = &local_40;
  QFileSystemEntry::QFileSystemEntry(this,in_stack_ffffffffffffff98);
  bVar1 = QFileSystemEngine::setCurrentPath(this);
  QFileSystemEntry::~QFileSystemEntry(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::setCurrent(const QString &path)
{
    return QFileSystemEngine::setCurrentPath(QFileSystemEntry(path));
}